

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* split_coopmat_pointer
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *expr)

{
  CompilerError *pCVar1;
  int iVar2;
  int iVar3;
  string ptr_expr;
  string index_expr;
  string local_48 [32];
  
  std::__cxx11::string::string((string *)&ptr_expr,(string *)expr);
  index_expr._M_dataplus._M_p = (pointer)&index_expr.field_2;
  index_expr._M_string_length = 0;
  index_expr.field_2._M_local_buf[0] = '\0';
  if (ptr_expr._M_dataplus._M_p[ptr_expr._M_string_length - 1] != ']') {
    pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
    spirv_cross::CompilerError::CompilerError
              (pCVar1,"Access chain for coopmat must be indexed into an array.");
    __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar3 = 1;
  while( true ) {
    std::__cxx11::string::pop_back();
    if (iVar3 == 0) break;
    if (ptr_expr._M_string_length == 0) goto LAB_002af35e;
    iVar2 = -(uint)(ptr_expr._M_dataplus._M_p[ptr_expr._M_string_length - 1] == '[');
    if (ptr_expr._M_dataplus._M_p[ptr_expr._M_string_length - 1] == ']') {
      iVar2 = 1;
    }
    iVar3 = iVar3 + iVar2;
  }
  if (ptr_expr._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)expr);
    std::__cxx11::string::operator=((string *)&index_expr,local_48);
    std::__cxx11::string::~string(local_48);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&ptr_expr,&index_expr);
    std::__cxx11::string::~string((string *)&index_expr);
    std::__cxx11::string::~string((string *)&ptr_expr);
    return __return_storage_ptr__;
  }
LAB_002af35e:
  pCVar1 = (CompilerError *)__cxa_allocate_exception(0x10);
  spirv_cross::CompilerError::CompilerError(pCVar1,"Invalid pointer expression for coopmat.");
  __cxa_throw(pCVar1,&spirv_cross::CompilerError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static pair<string, string> split_coopmat_pointer(const string &expr)
{
	auto ptr_expr = expr;
	string index_expr;

	if (ptr_expr.back() != ']')
		SPIRV_CROSS_THROW("Access chain for coopmat must be indexed into an array.");

	// Strip the access chain.
	ptr_expr.pop_back();
	uint32_t counter = 1;
	while (counter && !ptr_expr.empty())
	{
		if (ptr_expr.back() == ']')
			counter++;
		else if (ptr_expr.back() == '[')
			counter--;
		ptr_expr.pop_back();
	}

	if (ptr_expr.empty())
		SPIRV_CROSS_THROW("Invalid pointer expression for coopmat.");

	index_expr = expr.substr(ptr_expr.size() + 1, expr.size() - (ptr_expr.size() + 1) - 1);
	return { std::move(ptr_expr), std::move(index_expr) };
}